

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::compute_pca
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *axis_res,
          vec<16U,_float> *centroid_res,weighted_vec_array *vecs,vector<unsigned_int> *indices)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint *puVar3;
  weighted_vec *pwVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint i_2;
  int iVar10;
  float *pfVar11;
  float *pfVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  undefined8 *puVar16;
  long lVar17;
  float *pfVar18;
  uint x;
  long lVar19;
  uint uVar20;
  uint uVar22;
  double dVar21;
  uint uVar23;
  uint uVar24;
  float fVar25;
  vec<16U,_float> axis;
  vec<16U,_float> centroid;
  vec<16U,_float> prev_axis;
  vec<16U,_float> x_2;
  vec<16U,_float> delta_axis;
  matrix<16U,_16U,_float> covar;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  double local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  float local_470 [272];
  
  local_518 = 0;
  uStack_510 = 0;
  local_528 = 0;
  uStack_520 = 0;
  local_538 = 0;
  uStack_530 = 0;
  local_548 = 0;
  uStack_540 = 0;
  uVar14 = (ulong)indices->m_size;
  local_4c8 = 0.0;
  if (uVar14 != 0) {
    puVar3 = indices->m_p;
    pwVar4 = vecs->m_p;
    uVar13 = 0;
    do {
      uVar20 = puVar3[uVar13];
      fVar25 = (float)pwVar4[uVar20].m_weight;
      lVar15 = 0;
      do {
        pfVar11 = pwVar4[uVar20].m_vec.m_s + lVar15;
        fVar5 = pfVar11[1];
        fVar6 = pfVar11[2];
        fVar7 = pfVar11[3];
        local_470[lVar15 + 0x10] = *pfVar11 * fVar25;
        local_470[lVar15 + 0x11] = fVar5 * fVar25;
        local_470[lVar15 + 0x12] = fVar6 * fVar25;
        local_470[lVar15 + 0x13] = fVar7 * fVar25;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x10);
      lVar15 = 0;
      do {
        fVar25 = local_470[lVar15 + 0x11];
        fVar5 = local_470[lVar15 + 0x12];
        fVar6 = local_470[lVar15 + 0x13];
        lVar19 = lVar15 * 4;
        fVar7 = *(float *)((long)&local_548 + lVar19 + 4);
        fVar8 = *(float *)((long)&uStack_540 + lVar19);
        fVar9 = *(float *)((long)&uStack_540 + lVar19 + 4);
        lVar17 = lVar15 * 4;
        *(float *)((long)&local_548 + lVar17) =
             *(float *)((long)&local_548 + lVar19) + local_470[lVar15 + 0x10];
        *(float *)((long)&local_548 + lVar17 + 4) = fVar7 + fVar25;
        *(float *)((long)&uStack_540 + lVar17) = fVar8 + fVar5;
        *(float *)((long)&uStack_540 + lVar17 + 4) = fVar9 + fVar6;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x10);
      local_4c8 = local_4c8 + (double)pwVar4[uVar20].m_weight;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar14);
  }
  if ((local_4c8 != 0.0) || (NAN(local_4c8))) {
    local_4c8 = 1.0 / local_4c8;
    uStack_4c0 = 0;
    lVar15 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&uStack_540 + lVar15 * 4);
      uVar2 = *(undefined8 *)((long)&local_548 + lVar15 * 4);
      *(ulong *)((long)&local_548 + lVar15 * 4) =
           CONCAT44((float)((double)(float)((ulong)uVar2 >> 0x20) * local_4c8),
                    (float)((double)(float)uVar2 * local_4c8));
      *(ulong *)((long)&uStack_540 + lVar15 * 4) =
           CONCAT44((float)((double)(float)((ulong)uVar1 >> 0x20) * local_4c8),
                    (float)((double)(float)uVar1 * local_4c8));
      lVar15 = lVar15 + 4;
    } while (lVar15 != 0x10);
    memset(local_470 + 0x10,0,0x400);
    if (uVar14 != 0) {
      puVar3 = indices->m_p;
      pwVar4 = vecs->m_p;
      uVar13 = 0;
      do {
        uVar20 = puVar3[uVar13];
        lVar15 = 0;
        do {
          pfVar11 = pwVar4[uVar20].m_vec.m_s + lVar15;
          fVar25 = pfVar11[1];
          fVar5 = pfVar11[2];
          fVar6 = pfVar11[3];
          lVar17 = lVar15 * 4;
          fVar7 = *(float *)((long)&local_548 + lVar17 + 4);
          fVar8 = *(float *)((long)&uStack_540 + lVar17);
          fVar9 = *(float *)((long)&uStack_540 + lVar17 + 4);
          lVar19 = lVar15 * 4;
          *(float *)((long)&local_588 + lVar19) = *pfVar11 - *(float *)((long)&local_548 + lVar17);
          *(float *)((long)&local_588 + lVar19 + 4) = fVar25 - fVar7;
          *(float *)((long)&uStack_580 + lVar19) = fVar5 - fVar8;
          *(float *)((long)&uStack_580 + lVar19 + 4) = fVar6 - fVar9;
          lVar15 = lVar15 + 4;
        } while (lVar15 != 0x10);
        fVar25 = (float)pwVar4[uVar20].m_weight;
        lVar15 = 0;
        do {
          lVar19 = lVar15 * 4;
          fVar5 = *(float *)((long)&local_588 + lVar19 + 4);
          fVar6 = *(float *)((long)&uStack_580 + lVar19);
          fVar7 = *(float *)((long)&uStack_580 + lVar19 + 4);
          lVar17 = lVar15 * 4;
          *(float *)((long)&local_508 + lVar17) = *(float *)((long)&local_588 + lVar19) * fVar25;
          *(float *)((long)&local_508 + lVar17 + 4) = fVar5 * fVar25;
          *(float *)((long)&uStack_500 + lVar17) = fVar6 * fVar25;
          *(float *)((long)&uStack_500 + lVar17 + 4) = fVar7 * fVar25;
          lVar15 = lVar15 + 4;
        } while (lVar15 != 0x10);
        lVar15 = 0;
        puVar16 = &local_508;
        pfVar11 = local_470 + 0x10;
        do {
          fVar25 = *(float *)((long)&local_588 + lVar15 * 4);
          lVar19 = -0x10;
          do {
            pfVar11[lVar19 + 0x10] =
                 *(float *)((long)puVar16 + lVar19 * 4 + 0x40) * fVar25 + pfVar11[lVar19 + 0x10];
            lVar19 = lVar19 + 1;
          } while (lVar15 + lVar19 != 0);
          lVar15 = lVar15 + 1;
          pfVar11 = pfVar11 + 0x11;
          puVar16 = (undefined8 *)((long)puVar16 + 4);
        } while (lVar15 != 0x10);
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar14);
    }
    pfVar11 = local_470 + 0x10;
    lVar15 = 0;
    do {
      lVar19 = -0x10;
      do {
        pfVar11[lVar19 + 0x10] = (float)((double)pfVar11[lVar19 + 0x10] * local_4c8);
        lVar19 = lVar19 + 1;
      } while (lVar15 + lVar19 != 0);
      lVar15 = lVar15 + 1;
      pfVar11 = pfVar11 + 0x11;
    } while (lVar15 != 0x10);
    pfVar12 = local_470;
    pfVar11 = local_470 + 0x20;
    lVar15 = 0;
    do {
      pfVar12 = pfVar12 + 0x11;
      lVar19 = lVar15 + 1;
      lVar17 = -0xf;
      pfVar18 = pfVar11;
      do {
        *pfVar18 = pfVar12[lVar17 + 0xf];
        lVar17 = lVar17 + 1;
        pfVar18 = pfVar18 + 0x10;
      } while (lVar15 + lVar17 != 0);
      pfVar11 = pfVar11 + 0x11;
      lVar15 = lVar19;
    } while (lVar19 != 0xf);
    uVar20 = 0;
    uVar22 = 1;
    uVar23 = 2;
    uVar24 = 3;
    lVar15 = 0;
    do {
      lVar19 = lVar15 * 4;
      *(float *)((long)&local_588 + lVar19) =
           (((float)(uVar20 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar20 & 0xffff | 0x4b000000)) * 0.06666667 * 0.5 + 0.75;
      *(float *)((long)&local_588 + lVar19 + 4) =
           (((float)(uVar22 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar22 & 0xffff | 0x4b000000)) * 0.06666667 * 0.5 + 0.75;
      *(float *)((long)&uStack_580 + lVar19) =
           (((float)(uVar23 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar23 & 0xffff | 0x4b000000)) * 0.06666667 * 0.5 + 0.75;
      *(float *)((long)&uStack_580 + lVar19 + 4) =
           (((float)(uVar24 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar24 & 0xffff | 0x4b000000)) * 0.06666667 * 0.5 + 0.75;
      lVar15 = lVar15 + 4;
      uVar20 = uVar20 + 4;
      uVar22 = uVar22 + 4;
      uVar23 = uVar23 + 4;
      uVar24 = uVar24 + 4;
    } while (lVar15 != 0x10);
    local_4d8 = local_558;
    uStack_4d0 = uStack_550;
    local_4e8 = local_568;
    uStack_4e0 = uStack_560;
    local_4f8 = local_578;
    uStack_4f0 = uStack_570;
    local_508 = local_588;
    uStack_500 = uStack_580;
    iVar10 = 0;
    do {
      lVar15 = 0;
      fVar25 = 0.0;
      pfVar11 = local_470;
      do {
        pfVar11 = pfVar11 + 0x10;
        fVar5 = 0.0;
        lVar19 = 0;
        do {
          fVar5 = fVar5 + *(float *)((long)&local_588 + lVar19 * 4) * pfVar11[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x10);
        *(float *)((long)&local_4b0 + lVar15 * 4) = fVar5;
        if (fVar25 <= ABS(fVar5)) {
          fVar25 = ABS(fVar5);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x10);
      if ((fVar25 != 0.0) || (NAN(fVar25))) {
        fVar25 = 1.0 / fVar25;
        lVar15 = 0;
        do {
          lVar19 = lVar15 * 4;
          fVar5 = *(float *)((long)&local_4b0 + lVar19 + 4);
          fVar6 = *(float *)((long)&uStack_4a8 + lVar19);
          fVar7 = *(float *)((long)&uStack_4a8 + lVar19 + 4);
          lVar17 = lVar15 * 4;
          *(float *)((long)&local_4b0 + lVar17) = *(float *)((long)&local_4b0 + lVar19) * fVar25;
          *(float *)((long)&local_4b0 + lVar17 + 4) = fVar5 * fVar25;
          *(float *)((long)&uStack_4a8 + lVar17) = fVar6 * fVar25;
          *(float *)((long)&uStack_4a8 + lVar17 + 4) = fVar7 * fVar25;
          lVar15 = lVar15 + 4;
        } while (lVar15 != 0x10);
      }
      lVar15 = 0;
      do {
        lVar19 = lVar15 * 4;
        fVar25 = *(float *)((long)&local_508 + lVar19 + 4);
        fVar5 = *(float *)((long)&uStack_500 + lVar19);
        fVar6 = *(float *)((long)&uStack_500 + lVar19 + 4);
        lVar17 = lVar15 * 4;
        fVar7 = *(float *)((long)&local_4b0 + lVar17 + 4);
        fVar8 = *(float *)((long)&uStack_4a8 + lVar17);
        fVar9 = *(float *)((long)&uStack_4a8 + lVar17 + 4);
        local_470[lVar15] =
             *(float *)((long)&local_508 + lVar19) - *(float *)((long)&local_4b0 + lVar17);
        local_470[lVar15 + 1] = fVar25 - fVar7;
        local_470[lVar15 + 2] = fVar5 - fVar8;
        local_470[lVar15 + 3] = fVar6 - fVar9;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x10);
      local_4d8 = local_558;
      uStack_4d0 = uStack_550;
      local_4e8 = local_568;
      uStack_4e0 = uStack_560;
      local_4f8 = local_578;
      uStack_4f0 = uStack_570;
      local_508 = local_588;
      uStack_500 = uStack_580;
      local_588 = local_4b0;
      uVar1 = local_588;
      uStack_580 = uStack_4a8;
      local_578 = local_4a0;
      uStack_570 = uStack_498;
      local_568 = local_490;
      uStack_560 = uStack_488;
      local_558 = local_480;
      uStack_550 = uStack_478;
      fVar25 = local_470[0] * local_470[0];
      lVar15 = 1;
      do {
        fVar25 = fVar25 + local_470[lVar15] * local_470[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x10);
    } while ((0.0025 <= fVar25) && (iVar10 = iVar10 + 1, iVar10 != 10));
    local_588._0_4_ = (float)local_4b0;
    dVar21 = (double)((float)local_588 * (float)local_588);
    lVar15 = 1;
    do {
      fVar25 = *(float *)((long)&local_588 + lVar15 * 4);
      dVar21 = dVar21 + (double)(fVar25 * fVar25);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x10);
    local_588 = uVar1;
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      if (dVar21 < 0.0) {
        dVar21 = sqrt(dVar21);
      }
      else {
        dVar21 = SQRT(dVar21);
      }
      fVar25 = (float)(1.0 / dVar21);
      lVar15 = 0;
      do {
        lVar19 = lVar15 * 4;
        fVar5 = *(float *)((long)&local_588 + lVar19 + 4);
        fVar6 = *(float *)((long)&uStack_580 + lVar19);
        fVar7 = *(float *)((long)&uStack_580 + lVar19 + 4);
        lVar17 = lVar15 * 4;
        *(float *)((long)&local_588 + lVar17) = *(float *)((long)&local_588 + lVar19) * fVar25;
        *(float *)((long)&local_588 + lVar17 + 4) = fVar5 * fVar25;
        *(float *)((long)&uStack_580 + lVar17) = fVar6 * fVar25;
        *(float *)((long)&uStack_580 + lVar17 + 4) = fVar7 * fVar25;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x10);
    }
    *(undefined8 *)(axis_res->m_s + 0xc) = local_558;
    *(undefined8 *)(axis_res->m_s + 0xe) = uStack_550;
    *(undefined8 *)(axis_res->m_s + 8) = local_568;
    *(undefined8 *)(axis_res->m_s + 10) = uStack_560;
    *(undefined8 *)(axis_res->m_s + 4) = local_578;
    *(undefined8 *)(axis_res->m_s + 6) = uStack_570;
  }
  else {
    local_588 = 0;
    uStack_580 = 0;
    axis_res->m_s[0xc] = 0.0;
    axis_res->m_s[0xd] = 0.0;
    axis_res->m_s[0xe] = 0.0;
    axis_res->m_s[0xf] = 0.0;
    axis_res->m_s[8] = 0.0;
    axis_res->m_s[9] = 0.0;
    axis_res->m_s[10] = 0.0;
    axis_res->m_s[0xb] = 0.0;
    axis_res->m_s[4] = 0.0;
    axis_res->m_s[5] = 0.0;
    axis_res->m_s[6] = 0.0;
    axis_res->m_s[7] = 0.0;
  }
  *(undefined8 *)axis_res->m_s = local_588;
  *(undefined8 *)(axis_res->m_s + 2) = uStack_580;
  *(undefined8 *)(centroid_res->m_s + 0xc) = local_518;
  *(undefined8 *)(centroid_res->m_s + 0xe) = uStack_510;
  *(undefined8 *)(centroid_res->m_s + 8) = local_528;
  *(undefined8 *)(centroid_res->m_s + 10) = uStack_520;
  *(undefined8 *)(centroid_res->m_s + 4) = local_538;
  *(undefined8 *)(centroid_res->m_s + 6) = uStack_530;
  *(undefined8 *)centroid_res->m_s = local_548;
  *(undefined8 *)(centroid_res->m_s + 2) = uStack_540;
  return;
}

Assistant:

void compute_pca(VectorType& axis_res, VectorType& centroid_res, const weighted_vec_array& vecs, const vector<uint>& indices) {
    const uint N = VectorType::num_elements;

    VectorType centroid(0.0f);
    double total_weight = 0.0f;
    for (uint i = 0; i < indices.size(); i++) {
      const weighted_vec& v = vecs[indices[i]];
      centroid += v.m_vec * static_cast<float>(v.m_weight);
      total_weight += v.m_weight;
    }

    if (total_weight == 0.0f) {
      axis_res.clear();
      centroid_res = centroid;
      return;
    }

    double one_over_total_weight = 1.0f / total_weight;
    for (uint i = 0; i < N; i++)
      centroid[i] = static_cast<float>(centroid[i] * one_over_total_weight);

    matrix<N, N, float> covar;
    covar.clear();

    for (uint i = 0; i < indices.size(); i++) {
      const weighted_vec& weighted_vec = vecs[indices[i]];

      const VectorType v(weighted_vec.m_vec - centroid);
      const VectorType w(v * static_cast<float>(weighted_vec.m_weight));

      for (uint x = 0; x < N; x++)
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
    }

    for (uint x = 0; x < N; x++)
      for (uint y = x; y < N; y++)
        covar[x][y] = static_cast<float>(covar[x][y] * one_over_total_weight);

    for (uint x = 0; x < (N - 1); x++)
      for (uint y = x + 1; y < N; y++)
        covar[y][x] = covar[x][y];

    VectorType axis;
    for (uint i = 0; i < N; i++)
      axis[i] = math::lerp(.75f, 1.25f, i * (1.0f / (N - 1)));

    VectorType prev_axis(axis);

    const uint cMaxIterations = 10;
    for (uint iter = 0; iter < cMaxIterations; iter++) {
      VectorType x;

      double max_sum = 0;

      for (uint i = 0; i < N; i++) {
        double sum = 0;

        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];

        x[i] = static_cast<float>(sum);

        max_sum = math::maximum(max_sum, fabs(sum));
      }

      if (max_sum != 0.0f)
        x *= static_cast<float>(1.0f / max_sum);

      VectorType delta_axis(prev_axis - x);

      prev_axis = axis;
      axis = x;

      if (delta_axis.norm() < .0025f)
        break;
    }

    axis.normalize();

    axis_res = axis;
    centroid_res = centroid;
  }